

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O0

int __thiscall Edge::binarySearch(Edge *this,pair<int,_int> range,double angle)

{
  CoeffReturnType pdVar1;
  int *piVar2;
  undefined8 in_RSI;
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double mid_angle;
  int range_min;
  int m;
  int e;
  int s;
  size_type in_stack_ffffffffffffffa8;
  double __n;
  double local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  int local_c;
  int iStack_8;
  int local_4;
  
  local_c = (int)in_RSI;
  local_24 = local_c;
  iStack_8 = (int)((ulong)in_RSI >> 0x20);
  local_28 = iStack_8;
  local_2c = (local_c + iStack_8) / 2;
  local_20 = in_XMM0_Qa;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::at(in_RDI,in_stack_ffffffffffffffa8);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x1468c0);
  if (*pdVar1 - 1e-07 <= in_XMM0_Qa) {
    __n = local_20;
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::at(in_RDI,(size_type)local_20);
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14690b);
    if (__n <= *pdVar1 + 1e-07) {
      local_34 = 1;
      piVar2 = std::max<int>(&local_34,&local_c);
      local_30 = *piVar2;
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::at(in_RDI,(size_type)__n);
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x146965);
      local_40 = *pdVar1;
      while (local_24 < local_28) {
        if (local_40 - 1e-07 <= local_20) {
          if (local_20 <= local_40 + 1e-07) {
            piVar2 = std::max<int>(&local_30,&local_2c);
            return *piVar2;
          }
          local_24 = local_2c + 1;
        }
        else {
          local_28 = local_2c;
        }
        local_2c = (local_24 + local_28) / 2;
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::at(in_RDI,(size_type)__n);
        pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x146a0c);
        local_40 = *pdVar1;
      }
      piVar2 = std::max<int>(&local_30,&local_24);
      local_4 = *piVar2;
    }
    else {
      local_4 = -2;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Edge::binarySearch(std::pair<int, int> range, double angle) const{
    int s = range.first, e = range.second, m = static_cast<int>((s + e) / 2);
    if (angle < at(s).z() - bs_margin) return -1;
    else if (angle > at(e).z() + bs_margin) return -2;
    int range_min = std::max(1, range.first);
    double mid_angle = at(m).z();
    while (s < e) {
        if (mid_angle - bs_margin > angle) {
            e = m;
        } else if (mid_angle + bs_margin < angle) {
            s = m + 1;
        } else {
            return std::max(range_min, m);
        }
        m = static_cast<int>((s + e) / 2);
        mid_angle = at(m).z();
    } 
    return std::max(range_min, s);
}